

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clGetPipeInfo(cl_mem pipe,cl_pipe_info param_name,size_t param_value_size,void *param_value,
                    size_t *param_value_size_ret)

{
  time_point start;
  CLIntercept *this;
  bool bVar1;
  cl_int cVar2;
  cl_icd_dispatch *pcVar3;
  SConfig *pSVar4;
  undefined8 uVar5;
  void *in_RCX;
  size_t in_RDX;
  cl_pipe_info in_ESI;
  CEnumNameMap *in_RDI;
  size_t *in_R8;
  cl_int in_stack_000000b4;
  char *in_stack_000000b8;
  CLIntercept *in_stack_000000c0;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  cl_pipe_info in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  CLIntercept *in_stack_fffffffffffffea8;
  uint64_t enqueueCounter_00;
  CEnumNameMap *this_00;
  int local_10c;
  CLIntercept *local_108;
  undefined8 local_100;
  allocator local_f1;
  cl_sync_point_khr *in_stack_ffffffffffffff10;
  cl_event *in_stack_ffffffffffffff18;
  cl_int in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  CLIntercept *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  undefined1 includeId;
  string *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  CLIntercept *in_stack_ffffffffffffff50;
  time_point in_stack_ffffffffffffff58;
  time_point in_stack_ffffffffffffff60;
  time_point end;
  undefined4 in_stack_ffffffffffffff70;
  CLIntercept *local_80;
  undefined8 local_78;
  string local_60 [32];
  uint64_t local_40;
  CLIntercept *local_38;
  size_t *local_30;
  void *local_28;
  size_t local_20;
  cl_pipe_info local_14;
  CEnumNameMap *local_10;
  cl_int local_4;
  
  includeId = (undefined1)((ulong)in_stack_ffffffffffffff38 >> 0x38);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_38 = GetIntercept();
  if ((local_38 == (CLIntercept *)0x0) ||
     (pcVar3 = CLIntercept::dispatch(local_38), pcVar3->clGetPipeInfo == (cl_api_clGetPipeInfo)0x0))
  {
    local_10c = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_10c);
    local_4 = -0x26;
  }
  else {
    local_40 = CLIntercept::getEnqueueCounter(in_stack_fffffffffffffea8);
    pSVar4 = CLIntercept::config(local_38);
    this = local_38;
    if ((pSVar4->CallLogging & 1U) != 0) {
      enqueueCounter_00 = local_40;
      this_00 = local_10;
      CLIntercept::enumName(local_38);
      CEnumNameMap::name_abi_cxx11_(this_00,(cl_int)(enqueueCounter_00 >> 0x20));
      uVar5 = std::__cxx11::string::c_str();
      in_stack_fffffffffffffea0 = local_14;
      CLIntercept::callLoggingEnter
                (this,"clGetPipeInfo",enqueueCounter_00,(cl_kernel)0x0,
                 "mem = %p, param_name = %s (%08X)",this_00,uVar5);
      std::__cxx11::string::~string(local_60);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    pSVar4 = CLIntercept::config(local_38);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_38), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      local_78 = std::chrono::_V2::steady_clock::now();
    }
    pcVar3 = CLIntercept::dispatch(local_38);
    cVar2 = (*pcVar3->clGetPipeInfo)((cl_mem)local_10,local_14,local_20,local_28,local_30);
    pSVar4 = CLIntercept::config(local_38);
    if (((pSVar4->HostPerformanceTiming & 1U) != 0) ||
       (pSVar4 = CLIntercept::config(local_38), (pSVar4->ChromeCallLogging & 1U) != 0)) {
      local_80 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      end.__d.__r = (duration)(duration)local_80;
      pSVar4 = CLIntercept::config(local_38);
      if (((pSVar4->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_38,local_40), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff48,"",(allocator *)&stack0xffffffffffffff47);
        start.__d.__r._4_4_ = cVar2;
        start.__d.__r._0_4_ = in_stack_ffffffffffffff70;
        in_stack_ffffffffffffff30 = local_80;
        uVar5 = local_78;
        CLIntercept::updateHostTimingStats
                  ((CLIntercept *)in_stack_ffffffffffffff60.__d.__r,
                   (char *)in_stack_ffffffffffffff58.__d.__r,(string *)in_stack_ffffffffffffff50,
                   start,end);
        includeId = (undefined1)((ulong)uVar5 >> 0x38);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if (((((pSVar4->ErrorLogging & 1U) != 0) ||
         (pSVar4 = CLIntercept::config(local_38), (pSVar4->ErrorAssert & 1U) != 0)) ||
        (pSVar4 = CLIntercept::config(local_38), (pSVar4->NoErrors & 1U) != 0)) && (cVar2 != 0)) {
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_000000c0,in_stack_000000b8,in_stack_000000b4);
      }
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar4 = CLIntercept::config(local_38);
      if ((pSVar4->NoErrors & 1U) != 0) {
        cVar2 = 0;
      }
    }
    pSVar4 = CLIntercept::config(local_38);
    if ((pSVar4->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    }
    pSVar4 = CLIntercept::config(local_38);
    local_4 = cVar2;
    if ((pSVar4->ChromeCallLogging & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xffffffffffffff10,"",&local_f1);
      local_100 = local_78;
      local_108 = local_80;
      CLIntercept::chromeCallLoggingExit
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 (bool)includeId,(uint64_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      local_4 = cVar2;
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clGetPipeInfo) (
    cl_mem pipe,
    cl_pipe_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clGetPipeInfo )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER( "mem = %p, param_name = %s (%08X)",
            pipe,
            pIntercept->enumName().name( param_name ).c_str(),
            param_name );
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clGetPipeInfo(
            pipe,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret );

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_MEM_OBJECT);
}